

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_test.cpp
# Opt level: O2

priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process> *
get_top_R_process(priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
                  *__return_storage_ptr__,int r,int field,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *pid_list)

{
  int iVar1;
  int iVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer ppVar5;
  bool bVar6;
  id_t __who;
  int nice;
  dirent *pdVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  mapped_type *status;
  ulong uVar9;
  mapped_type *pmVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  char *pcVar12;
  allocator local_1e2;
  allocator local_1e1;
  priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
  *local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  ulong local_1d0;
  DIR *local_1c8;
  string pid;
  compare_process cmp;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  stat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string task_dir;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  statm;
  key_type local_e8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_statm;
  
  top_statm._M_h._M_buckets = (__buckets_ptr)0x0;
  top_statm._M_h._M_bucket_count = 0;
  top_statm._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1d8 = pid_list;
  cmp.field = field;
  std::priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>::
  priority_queue(__return_storage_ptr__,&cmp,(vector<process,_std::allocator<process>_> *)&top_statm
                );
  std::vector<process,_std::allocator<process>_>::~vector
            ((vector<process,_std::allocator<process>_> *)&top_statm);
  std::__cxx11::string::string((string *)&task_dir,"/proc",(allocator *)&top_statm);
  local_1c8 = opendir(task_dir._M_dataplus._M_p);
  if (local_1c8 != (DIR *)0x0) {
    local_1d0 = (ulong)r;
    pvVar11 = local_1d8;
    local_1e0 = __return_storage_ptr__;
    while( true ) {
      pdVar7 = readdir(local_1c8);
      if (pdVar7 == (dirent *)0x0) break;
      pcVar12 = pdVar7->d_name;
      std::__cxx11::string::string((string *)&top_statm,pcVar12,(allocator *)&statm);
      bVar6 = is_digit((string *)&top_statm);
      std::__cxx11::string::~string((string *)&top_statm);
      if (bVar6) {
        std::__cxx11::string::string((string *)&pid,pcVar12,(allocator *)&top_statm);
        pbVar3 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar3 == pbVar4) {
LAB_0010802c:
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stat,
                         "/proc/",&pid);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &top_statm,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stat,
                         "/statm");
          read_pid_statm(&statm,(string *)&top_statm);
          std::__cxx11::string::~string((string *)&top_statm);
          std::__cxx11::string::~string((string *)&stat);
          std::operator+(&local_160,"/proc/",&pid);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &top_statm,&local_160,"/stat");
          read_pid_stat(&stat,(string *)&top_statm);
          std::__cxx11::string::~string((string *)&top_statm);
          std::__cxx11::string::~string((string *)&local_160);
          __who = std::__cxx11::stoi(&pid,(size_t *)0x0,10);
          nice = getpriority(PRIO_PROCESS,__who);
          std::__cxx11::string::string((string *)&top_statm,"status",(allocator *)&local_160);
          status = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&stat,(key_type *)&top_statm);
          update_process_cnt(status);
          std::__cxx11::string::~string((string *)&top_statm);
          ppVar5 = (__return_storage_ptr__->c).super__Vector_base<process,_std::allocator<process>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = ((long)(__return_storage_ptr__->c).
                         super__Vector_base<process,_std::allocator<process>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppVar5) / 0x98;
          if (local_1d0 <= uVar9) {
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&top_statm,&(ppVar5->statm)._M_h);
            std::__cxx11::string::string((string *)&local_160,"rss",&local_1e1);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&statm,&local_160);
            iVar1 = *pmVar10;
            std::__cxx11::string::string((string *)&local_e8,"rss",&local_1e2);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&top_statm,&local_e8);
            iVar2 = *pmVar10;
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_160);
            __return_storage_ptr__ = local_1e0;
            if (iVar2 < iVar1) {
              std::
              priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
              ::pop(local_1e0);
            }
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&top_statm);
            uVar9 = ((long)(__return_storage_ptr__->c).
                           super__Vector_base<process,_std::allocator<process>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(__return_storage_ptr__->c).
                          super__Vector_base<process,_std::allocator<process>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x98;
            pvVar11 = local_1d8;
          }
          if (uVar9 < local_1d0) {
            std::__cxx11::string::string((string *)&local_160,pcVar12,(allocator *)&local_e8);
            process::process((process *)&top_statm,&local_160,&statm,&stat,nice);
            std::
            priority_queue<process,_std::vector<process,_std::allocator<process>_>,_compare_process>
            ::push(__return_storage_ptr__,(process *)&top_statm);
            process::~process((process *)&top_statm);
            std::__cxx11::string::~string((string *)&local_160);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&stat._M_h);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&statm._M_h);
        }
        else {
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (pbVar3,pbVar4,&pid);
          if (_Var8._M_current !=
              (pvVar11->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010802c;
        }
        std::__cxx11::string::~string((string *)&pid);
      }
    }
    closedir(local_1c8);
  }
  std::__cxx11::string::~string((string *)&task_dir);
  return __return_storage_ptr__;
}

Assistant:

std::priority_queue<process, std::vector<process>, compare_process>
get_top_R_process(int r, int field, const std::vector<std::string> &pid_list) {
    compare_process cmp(field);
    std::priority_queue<process, std::vector<process>, compare_process> pq(cmp);

    std::string task_dir = "/proc";
    const char *d = task_dir.c_str();
    if (auto dir = opendir(d)) {
        while (auto f = readdir(dir)) {
            if (is_digit(f->d_name)) {
                std::string pid = f->d_name;

                if (!pid_list.empty() && std::find(pid_list.begin(), pid_list.end(), pid) == pid_list.end()) {
                    continue;
                }

                std::unordered_map<std::string, int> statm = read_pid_statm("/proc/" + pid + "/statm");
                std::unordered_map<std::string, std::string> stat = read_pid_stat("/proc/" + pid + "/stat");
                int nice = getpriority(PRIO_PROCESS, stoi(pid));

                update_process_cnt(stat["status"]);

                if (pq.size() >= r) {
                    std::unordered_map<std::string, int> top_statm = pq.top().statm;
                    if (statm["rss"] > top_statm["rss"]) {
                        pq.pop();
                    }
                }

                if (pq.size() < r) {
                    pq.push(process(f->d_name, statm, stat, nice));
                }
            }
        }
        closedir(dir);
    }

    return pq;
}